

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O0

void __thiscall MidiPlayerDialog::on_removeButton_clicked(MidiPlayerDialog *this)

{
  undefined8 uVar1;
  QListWidgetItem *pQVar2;
  QListWidgetItem *item;
  MidiPlayerDialog *this_local;
  
  uVar1 = *(undefined8 *)(this->ui + 0x18);
  QListWidget::currentRow();
  pQVar2 = (QListWidgetItem *)QListWidget::takeItem((int)uVar1);
  if (this->currentItem == pQVar2) {
    this->currentItem = (QListWidgetItem *)0x0;
    updateCurrentItem(this);
  }
  if (pQVar2 != (QListWidgetItem *)0x0) {
    (**(code **)(*(long *)pQVar2 + 8))();
  }
  return;
}

Assistant:

void MidiPlayerDialog::on_removeButton_clicked() {
	QListWidgetItem *item = ui->playList->takeItem(ui->playList->currentRow());
	if (currentItem == item) {
		// This ensures that playback will finish after the removed item.
		currentItem = NULL;
		updateCurrentItem();
	}
	delete item;
}